

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9_hashmap_key_exists(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  sxi32 sVar1;
  jx9_value *pObj;
  anon_union_8_3_18420de5_for_x aVar2;
  
  if ((nArg < 2) || ((apArg[1]->iFlags & 0x40) == 0)) {
    pObj = pCtx->pRet;
    jx9MemObjRelease(pObj);
    (pObj->x).rVal = 0.0;
  }
  else {
    sVar1 = jx9HashmapLookup((jx9_hashmap *)(apArg[1]->x).pOther,*apArg,(jx9_hashmap_node **)0x0);
    aVar2.iVal._1_7_ = 0;
    aVar2.iVal._0_1_ = sVar1 == 0;
    pObj = pCtx->pRet;
    jx9MemObjRelease(pObj);
    pObj->x = aVar2;
  }
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9_hashmap_key_exists(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	sxi32 rc;
	if( nArg < 2 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Make sure we are dealing with a valid hashmap */
	if( !jx9_value_is_json_array(apArg[1]) ){
		/* Invalid argument, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Perform the lookup */
	rc = jx9HashmapLookup((jx9_hashmap *)apArg[1]->x.pOther, apArg[0], 0);
	/* lookup result */
	jx9_result_bool(pCtx, rc == SXRET_OK ? 1 : 0);
	return JX9_OK;
}